

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int intEventSetFunc(uint event,void *f,int user,void *userdata)

{
  ulong uVar1;
  FILE *__stream;
  
  __stream = _stderr;
  uVar1 = (ulong)event;
  if ((4 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: event=%d function=%08X, user=%d, userdata=%08X\n",myTimeStamp::buf,
            "intEventSetFunc",uVar1,(ulong)f & 0xffffffff,(ulong)(uint)user,userdata);
  }
  eventAlert[uVar1].ex = user;
  eventAlert[uVar1].userdata = userdata;
  eventAlert[uVar1].func = (callbk_t)f;
  return event * 0x20;
}

Assistant:

static int intEventSetFunc(
   unsigned event,
   void *   f,
   int      user,
   void *   userdata)
{
   DBG(DBG_INTERNAL, "event=%d function=%08X, user=%d, userdata=%08X",
      event, (uint32_t)f, user, (uint32_t)userdata);

   eventAlert[event].ex = user;
   eventAlert[event].userdata = userdata;

   eventAlert[event].func = f;

   return 0;
}